

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O2

int custom_send(tr_socket *socket,void *pdu,size_t len,time_t timeout)

{
  uint uVar1;
  long lVar2;
  uint32_t uVar3;
  uint *puVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char *)((long)pdu + 1) == '\n') {
    uVar1 = *(uint *)((long)pdu + 8);
    puVar4 = (uint *)((long)pdu + (ulong)uVar1 + 0xc);
    uVar3 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,*(uint32_t *)((long)pdu + 4));
    if (puVar4 < (uint *)((ulong)uVar3 + (long)pdu)) {
      printf("err msg: %.*s\n",(ulong)*puVar4,(long)pdu + (ulong)uVar1 + 0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (int)len;
  }
  __stack_chk_fail();
}

Assistant:

static int custom_send(const struct tr_socket *socket __attribute__((unused)), const void *pdu, const size_t len,
		       const time_t timeout __attribute__((unused)))
{
	const struct pdu_error *err = pdu;

	if (err->type == 10) {
		uint32_t *errlen = (uint32_t *)((char *)err->rest + err->len_enc_pdu);

		if ((char *)errlen < (char *)err + BYTES32(err->len))
			printf("err msg: %.*s\n", *errlen, (char *)(errlen + 1));
	}
	return len;
}